

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O2

bool __thiscall opts::Options::parse(Options *this,int argc,char **argv)

{
  char *pcVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  mapped_type *ppBVar7;
  mapped_type *ppBVar8;
  ulong uVar9;
  iterator iVar10;
  ostream *poVar11;
  iterator iVar12;
  string *arg;
  long lVar13;
  _List_node_base *p_Var14;
  mapped_type pBVar15;
  char *arg_00;
  long lVar16;
  char c;
  uint local_1d8;
  int local_1d4;
  value_type local_1d0;
  map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
  short_opts;
  _Any_data local_180;
  code *local_170;
  code *local_168;
  _Any_data local_160;
  code *local_150;
  code *local_148;
  _Any_data local_140;
  code *local_130;
  code *local_128;
  _Any_data local_120;
  code *local_110;
  code *local_108;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
  long_opts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  short_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &short_opts._M_t._M_impl.super__Rb_tree_header._M_header;
  short_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  short_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  short_opts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  long_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &long_opts._M_t._M_impl.super__Rb_tree_header._M_header;
  long_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  long_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  long_opts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var14 = (_List_node_base *)&this->options;
  local_1d4 = argc;
  short_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       short_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  long_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       long_opts._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (p_Var14 = (((_List_base<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>,_std::allocator<std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>_>_>
                      *)&p_Var14->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var14 != (_List_node_base *)&this->options) {
    pBVar15 = (mapped_type)p_Var14[1]._M_next;
    if (pBVar15->s != '\0') {
      ppBVar7 = std::
                map<char,_opts::BasicOption_*,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                ::operator[](&short_opts,&pBVar15->s);
      *ppBVar7 = pBVar15;
      pBVar15 = (mapped_type)p_Var14[1]._M_next;
    }
    ppBVar8 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
              ::operator[](&long_opts,&pBVar15->l);
    *ppBVar8 = pBVar15;
  }
  local_1d8 = 1;
  iVar6 = local_1d4;
  do {
    if (iVar6 <= (int)local_1d8) {
      bVar3 = this->failed;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
      ::~_Rb_tree(&long_opts._M_t);
      std::
      _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
      ::~_Rb_tree(&short_opts._M_t);
      return (bool)(bVar3 ^ 1);
    }
    arg_00 = argv[(int)local_1d8];
    if (*arg_00 == '\0') goto LAB_00108066;
    if (*arg_00 == '-') {
      local_100._8_8_ = 0;
      local_100._M_unused._M_object = &short_opts;
      local_e8 = std::
                 _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                 ::_M_invoke;
      local_f0 = std::
                 _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                 ::_M_manager;
      bVar3 = dashed_non_option(arg_00,(IsShort *)&local_100);
      std::_Function_base::~_Function_base((_Function_base *)&local_100);
      iVar6 = local_1d4;
      uVar9 = (ulong)(int)local_1d8;
      arg_00 = argv[uVar9];
      if (bVar3) goto LAB_00108040;
      if (arg_00[1] == '-') {
        cVar4 = arg_00[2];
        if (cVar4 == '\0') {
          while (local_1d8 = (int)uVar9 + 1, (int)local_1d8 < iVar6) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1d0,argv[(int)local_1d8],(allocator<char> *)&c);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(&this->args,&local_1d0);
            std::__cxx11::string::~string((string *)&local_1d0);
            uVar9 = (ulong)local_1d8;
          }
          goto LAB_00108066;
        }
        lVar16 = 3;
        lVar13 = -2;
        while ((cVar4 != '\0' && (cVar4 != '='))) {
          pcVar1 = arg_00 + lVar16;
          lVar13 = lVar13 + -1;
          lVar16 = lVar16 + 1;
          cVar4 = *pcVar1;
        }
        if (lVar13 == -2) {
          this->failed = true;
          arg = &local_50;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)arg,arg_00,(allocator<char> *)&local_1d0);
          unrecognized_option(this,arg);
          iVar6 = local_1d4;
        }
        else {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1d0,arg_00 + 2,(long)arg_00 - lVar13);
          iVar12 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_opts::BasicOption_*>_>_>
                   ::find(&long_opts._M_t,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          iVar6 = local_1d4;
          if ((_Rb_tree_header *)iVar12._M_node != &long_opts._M_t._M_impl.super__Rb_tree_header) {
            local_120._8_8_ = 0;
            local_120._M_unused._M_object = &short_opts;
            local_108 = std::
                        _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                        ::_M_invoke;
            local_110 = std::
                        _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                        ::_M_manager;
            bVar5 = (**(code **)(**(long **)(iVar12._M_node + 2) + 0x18))
                              (*(long **)(iVar12._M_node + 2),local_1d4,argv,&local_1d8,
                               ((int)arg_00 - *(int *)(argv + (int)local_1d8)) - (int)lVar13,
                               &local_120);
            this->failed = (bool)(this->failed | bVar5 ^ 1);
            std::_Function_base::~_Function_base((_Function_base *)&local_120);
            goto LAB_00108066;
          }
          this->failed = true;
          arg = &local_70;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)arg,argv[(int)local_1d8],(allocator<char> *)&local_1d0);
          unrecognized_option(this,arg);
          iVar6 = local_1d4;
        }
        goto LAB_00108061;
      }
      if (arg_00[1] == '\0') {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1d0,arg_00,(allocator<char> *)&c);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->args,&local_1d0);
        goto LAB_0010805e;
      }
      iVar10 = std::
               _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
               ::find(&short_opts._M_t,arg_00 + 1);
      if ((_Rb_tree_header *)iVar10._M_node == &short_opts._M_t._M_impl.super__Rb_tree_header) {
        this->failed = true;
        arg = &local_90;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)arg,argv[(int)local_1d8],(allocator<char> *)&local_1d0);
        unrecognized_option(this,arg);
        goto LAB_00108061;
      }
      cVar4 = (**(code **)(*(long *)iVar10._M_node[1]._M_parent + 0x10))();
      p_Var2 = iVar10._M_node[1]._M_parent;
      if (cVar4 == '\0') {
        local_180._8_8_ = 0;
        local_180._M_unused._M_object = &short_opts;
        local_168 = std::
                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                    ::_M_invoke;
        local_170 = std::
                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                    ::_M_manager;
        bVar5 = (**(code **)(*(long *)p_Var2 + 0x18))(p_Var2,iVar6,argv,&local_1d8,2,&local_180);
        this->failed = (bool)(this->failed | bVar5 ^ 1);
        std::_Function_base::~_Function_base((_Function_base *)&local_180);
      }
      else {
        local_140._8_8_ = 0;
        local_140._M_unused._M_object = &short_opts;
        local_128 = std::
                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                    ::_M_invoke;
        local_130 = std::
                    _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                    ::_M_manager;
        (**(code **)(*(long *)p_Var2 + 0x18))(p_Var2,iVar6,argv,&local_1d8,0,&local_140);
        std::_Function_base::~_Function_base((_Function_base *)&local_140);
        lVar16 = 1;
        while( true ) {
          cVar4 = argv[(int)local_1d8][lVar16];
          iVar6 = local_1d4;
          c = cVar4;
          if (cVar4 == '\0') break;
          iVar6 = isprint((int)cVar4);
          if ((cVar4 == '-') || (iVar6 == 0)) {
            this->failed = true;
            poVar11 = std::operator<<((ostream *)&std::cerr,"error: invalid character\'");
            poVar11 = std::operator<<(poVar11,c);
            poVar11 = std::operator<<(poVar11," ignoring ");
            poVar11 = std::operator<<(poVar11,argv[(int)local_1d8] + lVar16);
            std::operator<<(poVar11,'\n');
            iVar6 = local_1d4;
            break;
          }
          iVar10 = std::
                   _Rb_tree<char,_std::pair<const_char,_opts::BasicOption_*>,_std::_Select1st<std::pair<const_char,_opts::BasicOption_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_opts::BasicOption_*>_>_>
                   ::find(&short_opts._M_t,(key_type_conflict *)&c);
          if ((_Rb_tree_header *)iVar10._M_node == &short_opts._M_t._M_impl.super__Rb_tree_header) {
            this->failed = true;
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            std::__cxx11::string::_M_construct((ulong)&local_1d0,'\x01');
            std::operator+(&local_b0,"-",&local_1d0);
            unrecognized_option(this,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
            std::__cxx11::string::~string((string *)&local_1d0);
          }
          else {
            cVar4 = (**(code **)(*(long *)iVar10._M_node[1]._M_parent + 0x10))();
            if (cVar4 == '\0') {
              this->failed = true;
              poVar11 = std::operator<<((ostream *)&std::cerr,
                                        "error: non-void options not allowed in option packs; ignoring "
                                       );
              poVar11 = std::operator<<(poVar11,c);
              std::operator<<(poVar11,'\n');
            }
            else {
              local_160._8_8_ = 0;
              local_160._M_unused._M_object = &short_opts;
              local_148 = std::
                          _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                          ::_M_invoke;
              local_150 = std::
                          _Function_handler<bool_(char),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/examples/reduce/../opts.h:388:21)>
                          ::_M_manager;
              (**(code **)(*(long *)iVar10._M_node[1]._M_parent + 0x18))
                        (iVar10._M_node[1]._M_parent,local_1d4,argv,&local_1d8,0,&local_160);
              std::_Function_base::~_Function_base((_Function_base *)&local_160);
            }
          }
          lVar16 = lVar16 + 1;
        }
      }
    }
    else {
LAB_00108040:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,arg_00,(allocator<char> *)&c);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->args,&local_1d0);
LAB_0010805e:
      arg = &local_1d0;
LAB_00108061:
      std::__cxx11::string::~string((string *)arg);
    }
LAB_00108066:
    local_1d8 = local_1d8 + 1;
  } while( true );
}

Assistant:

bool
Options::parse(int argc, char** argv)
{
    std::map<char, BasicOption*>                    short_opts;
    std::map<std::string, BasicOption*>             long_opts;

    for (auto& opt : options)
    {
        if (opt->s)
            short_opts[opt->s] = opt.get();

        long_opts[opt->l] = opt.get();
    }

    auto is_short = [&short_opts](char c) -> bool   { return short_opts.find(c) != short_opts.end(); };

    for (int i = 1; i < argc; ++i)
    {
        if( argv[ i ][ 0 ] == '\0' )
            continue;
        if( argv[ i ][ 0 ] != '-' || dashed_non_option(argv[i], is_short))
            args.push_back(argv[i]);
        else
        {
            // -...
            if( argv[ i ][ 1 ] == '\0' )
            {
                // -
                args.push_back(argv[i]);
            } else if( argv[ i ][ 1 ] == '-' )
            {
                if( argv[ i ][ 2 ] == '\0' )
                {
                    // --
                    while( ++i < argc )
                        args.push_back(argv[i]);
                } else {
                    // --...
                    char* first = &argv[ i ][ 2 ];
                    char* last = first;
                    for(; *last != '=' && *last != '\0'; ++last);
                    if (first == last)
                    {
                        failed = true;
                        unrecognized_option(argv[i]);
                    } else
                    {
                        auto opt_it = long_opts.find(std::string{first,last});
                        if (opt_it == long_opts.end())
                        {
                            failed = true;
                            unrecognized_option(argv[i]);
                        } else
                        {
                            failed |= !opt_it->second->parse(argc, argv, i, static_cast<int>(last - argv[i]), is_short);
                        }
                    }
                }
            } else
            {
                // -f...
                auto opt_it = short_opts.find(argv[i][1]);
                if (opt_it == short_opts.end())
                {
                    failed = true;
                    unrecognized_option(argv[i]);
                } else if (opt_it->second->flag())
                {
                    opt_it->second->parse(argc, argv, i, 0, is_short);      // arguments are meaningless; just sets the flag

                    // -fgh
                    char c;
                    for(int j = 1; (c = argv[i][j]) != '\0'; ++j)
                    {
                        if (!std::isprint(c) || c == '-')
                        {
                            failed = true;
                            std::cerr << "error: invalid character\'" << c << " ignoring " << &argv[i][j] << '\n';
                            break;
                        }
                        opt_it = short_opts.find(c);
                        if (opt_it == short_opts.end())
                        {
                            failed = true;
                            unrecognized_option("-" + std::string(1, c));
                            continue;
                        }
                        if (!opt_it->second->flag())
                        {
                            failed = true;
                            std::cerr << "error: non-void options not allowed in option packs; ignoring " << c << '\n';
                            continue;
                        }
                        opt_it->second->parse(argc, argv, i, 0, is_short);     // arguments are meaningless; just sets the flag
                    }
                } else
                {
                    failed |= !opt_it->second->parse(argc, argv, i, 2, is_short);
                }
            }
        }
    }

    return !failed;
}